

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O1

int __thiscall cmCTestScriptHandler::RunConfigurationDashboard(cmCTestScriptHandler *this)

{
  string *filename;
  cmCTest *pcVar1;
  size_t sVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type sVar4;
  pointer pcVar5;
  char cVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  Status SVar11;
  ostream *poVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  uint uVar14;
  char *pcVar15;
  _Alloc_hider _Var16;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view arg;
  int retVal;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ctestCommands;
  string command;
  string output;
  string cmakeFailedOuput;
  ostringstream cmCTestLog_msg_3;
  ostringstream cmCTestLog_msg;
  uint local_4c0;
  undefined4 local_4bc;
  string local_4b8;
  string local_498;
  string local_478;
  char *local_458;
  long local_450;
  char local_448;
  undefined7 uStack_447;
  pointer local_438;
  long *local_430;
  long local_420 [2];
  undefined1 local_410 [112];
  ios_base local_3a0 [264];
  undefined1 local_298 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  size_type local_278;
  pointer local_270;
  ios_base local_228 [504];
  
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  local_498._M_string_length = 0;
  local_498.field_2._M_local_buf[0] = '\0';
  paVar13 = &local_478.field_2;
  local_478._M_string_length = 0;
  local_478.field_2._M_local_buf[0] = '\0';
  local_478._M_dataplus._M_p = (pointer)paVar13;
  local_4c0 = CheckOutSourceDir(this);
  uVar14 = local_4c0;
  if (local_4c0 == 0) {
    local_4c0 = BackupDirectories(this);
    pcVar15 = (char *)(ulong)local_4c0;
    uVar14 = local_4c0;
    if (local_4c0 == 0) {
      if ((this->EmptyBinDir == true) && (bVar8 = EmptyBinaryDirectory(&this->BinaryDir), !bVar8)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_298,"Problem removing the binary directory",0x25);
        std::ios::widen((char)(ostream *)local_298 + (char)*(undefined8 *)(local_298._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_298);
        std::ostream::flush();
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x2a6;
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                     ,0x2a6,(char *)local_410._0_8_,false);
        if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
          operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
        std::ios_base::~ios_base(local_228);
      }
      filename = &this->BinaryDir;
      bVar8 = cmsys::SystemTools::FileExists(filename);
      if ((bVar8) ||
         (((sVar2 = (this->SourceDir)._M_string_length, sVar2 == (this->BinaryDir)._M_string_length
           && ((sVar2 == 0 ||
               (iVar10 = bcmp((this->SourceDir)._M_dataplus._M_p,(this->BinaryDir)._M_dataplus._M_p,
                              sVar2), iVar10 == 0)))) ||
          (SVar11 = cmsys::SystemTools::MakeDirectory(filename,(mode_t *)0x0),
          SVar11.Kind_ == Success)))) {
        if (((this->EmptyBinDir == true) &&
            (sVar2 = (this->SourceDir)._M_string_length, sVar2 == (this->BinaryDir)._M_string_length
            )) && ((sVar2 == 0 ||
                   (iVar10 = bcmp((this->SourceDir)._M_dataplus._M_p,
                                  (this->BinaryDir)._M_dataplus._M_p,sVar2), iVar10 == 0)))) {
          if ((this->CVSCheckOut)._M_string_length == 0) {
            local_298._0_8_ = &local_288;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_298,
                       "You have specified the source and binary directories to be the same (an in source build). You have also specified that the binary directory is to be erased. This means that the source will have to be checked out from CVS. But you have not specified CTEST_CVS_CHECKOUT"
                       ,"");
            cmSystemTools::Error((string *)local_298);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._0_8_ != &local_288) {
              operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
            }
            uVar14 = 8;
            goto LAB_0059773d;
          }
          local_4c0 = CheckOutSourceDir(this);
          if (local_4c0 != 0) {
            RestoreBackupDirectories(this);
            uVar14 = local_4c0;
            goto LAB_0059773d;
          }
        }
        PerformExtraUpdates(this);
        local_4c0 = 0;
        if (((this->InitialCache)._M_string_length == 0) ||
           (bVar8 = WriteInitialCache(filename,&this->InitialCache), bVar8)) {
          local_458 = &local_448;
          local_450 = 0;
          local_448 = '\0';
          paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(this->CMakeCmd)._M_string_length;
          local_4bc = (undefined4)CONCAT71((int7)((ulong)paVar13 >> 8),1);
          if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) {
            local_298._8_8_ = (this->CMakeCmd)._M_dataplus._M_p;
            local_288._M_allocated_capacity = 2;
            local_288._8_8_ = (long)"Ignoring extra path from command line:\n \"" + 0x27;
            local_270 = (this->SourceDir)._M_dataplus._M_p;
            local_278 = (this->SourceDir)._M_string_length;
            views._M_len = 3;
            views._M_array = (iterator)local_298;
            local_298._0_8_ = paVar3;
            cmCatViews_abi_cxx11_((string *)local_410,views);
            std::__cxx11::string::operator=((string *)&local_498,(string *)local_410);
            pcVar15 = local_410 + 0x10;
            if ((char *)local_410._0_8_ != pcVar15) {
              operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
            }
            local_478._M_string_length = 0;
            *local_478._M_dataplus._M_p = '\0';
            std::__cxx11::string::append((char *)&local_498);
            local_4c0 = 0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_298,"Run cmake command: ",0x13);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_298,local_498._M_dataplus._M_p,
                                 local_498._M_string_length);
            std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                         ,0x2e4,(char *)local_410._0_8_,false);
            if ((char *)local_410._0_8_ != pcVar15) {
              operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
            std::ios_base::~ios_base(local_228);
            bVar8 = cmSystemTools::RunSingleCommand
                              (&local_498,&local_478,&local_478,(int *)&local_4c0,
                               (this->BinaryDir)._M_dataplus._M_p,
                               (this->super_cmCTestGenericHandler).HandlerVerbose,(cmDuration)0x0);
            sVar4 = (this->CMOutFile)._M_string_length;
            if (sVar4 != 0) {
              pcVar5 = (this->CMOutFile)._M_dataplus._M_p;
              local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
              std::__cxx11::string::_M_construct<char*>((string *)&local_4b8,pcVar5,pcVar5 + sVar4);
              bVar9 = cmsys::SystemTools::FileIsFullPath(&local_4b8);
              if (!bVar9) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_410,filename,"/");
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_298,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_410,&local_4b8);
                std::__cxx11::string::operator=((string *)&local_4b8,(string *)local_298);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_298._0_8_ != &local_288) {
                  operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
                }
                if ((char *)local_410._0_8_ != pcVar15) {
                  operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
                }
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_298,"Write CMake output to file: ",0x1c);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_298,local_4b8._M_dataplus._M_p,
                                   local_4b8._M_string_length);
              std::endl<char,std::char_traits<char>>(poVar12);
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar1,5,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                           ,0x2f1,(char *)local_410._0_8_,false);
              if ((char *)local_410._0_8_ != pcVar15) {
                operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
              std::ios_base::~ios_base(local_228);
              cmGeneratedFileStream::cmGeneratedFileStream
                        ((cmGeneratedFileStream *)local_298,&local_4b8,false,None);
              if ((*(byte *)((long)&local_278 + *(long *)(local_298._0_8_ + -0x18)) & 5) == 0) {
                std::operator<<((ostream *)local_298,local_478._M_dataplus._M_p);
              }
              else {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_410,"Cannot open CMake output file: ",0x1f);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_410,local_4b8._M_dataplus._M_p,
                                     local_4b8._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12," for writing",0xc);
                std::endl<char,std::char_traits<char>>(poVar12);
                pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar1,7,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                             ,0x2f8,(char *)local_430,false);
                if (local_430 != local_420) {
                  operator_delete(local_430,local_420[0] + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
                std::ios_base::~ios_base(local_3a0);
              }
              cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
                operator_delete(local_4b8._M_dataplus._M_p,
                                local_4b8.field_2._M_allocated_capacity + 1);
              }
            }
            if (!bVar8 || local_4c0 != 0) {
              std::__cxx11::string::_M_assign((string *)&local_458);
              local_4bc = 0;
            }
          }
          uVar14 = (uint)pcVar15;
          arg._M_str = (this->CTestCmd)._M_dataplus._M_p;
          arg._M_len = (this->CTestCmd)._M_string_length;
          cmExpandedList_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_4b8,arg,false);
          local_438 = (pointer)local_4b8._M_string_length;
          bVar8 = local_4b8._M_dataplus._M_p == (pointer)local_4b8._M_string_length;
          if (!bVar8) {
            _Var16._M_p = local_4b8._M_dataplus._M_p;
            do {
              std::__cxx11::string::_M_assign((string *)&local_498);
              local_478._M_string_length = 0;
              *local_478._M_dataplus._M_p = '\0';
              local_4c0 = 0;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_298,"Run ctest command: ",0x13);
              poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_298,local_498._M_dataplus._M_p,
                                   local_498._M_string_length);
              std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
              std::ostream::put((char)poVar12);
              std::ostream::flush();
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar1,5,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                           ,0x30a,(char *)local_410._0_8_,false);
              if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
                operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
              std::ios_base::~ios_base(local_228);
              bVar9 = cmSystemTools::RunSingleCommand
                                (&local_498,&local_478,&local_478,(int *)&local_4c0,
                                 (this->BinaryDir)._M_dataplus._M_p,
                                 (this->super_cmCTestGenericHandler).HandlerVerbose,(cmDuration)0x0)
              ;
              if ((((byte)local_4bc & bVar9) != 1) || (bVar7 = true, (local_4c0 & 4) != 0)) {
                RestoreBackupDirectories(this);
                cVar6 = (char)(ostringstream *)local_298;
                if ((char)local_4bc == '\0') {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_298,"Unable to run cmake:",0x14);
                  std::ios::widen((char)*(undefined8 *)(local_298._0_8_ + -0x18) + cVar6);
                  std::ostream::put(cVar6);
                  poVar12 = (ostream *)std::ostream::flush();
                  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar12,local_458,local_450);
                  std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
                  std::ostream::put((char)poVar12);
                  std::ostream::flush();
                  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar1,7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                               ,0x315,(char *)local_410._0_8_,false);
                  if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
                    operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
                  std::ios_base::~ios_base(local_228);
                  pcVar15 = (char *)0xa;
                }
                else {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_298,"Unable to run ctest:",0x14);
                  std::ios::widen((char)*(undefined8 *)(local_298._0_8_ + -0x18) + cVar6);
                  std::ostream::put(cVar6);
                  poVar12 = (ostream *)std::ostream::flush();
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"command: ",9);
                  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar12,local_498._M_dataplus._M_p,local_498._M_string_length
                                      );
                  std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
                  std::ostream::put((char)poVar12);
                  poVar12 = (ostream *)std::ostream::flush();
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"output: ",8);
                  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar12,local_478._M_dataplus._M_p,local_478._M_string_length
                                      );
                  std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
                  std::ostream::put((char)poVar12);
                  std::ostream::flush();
                  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar1,7,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                               ,0x31b,(char *)local_410._0_8_,false);
                  if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
                    operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
                  std::ios_base::~ios_base(local_228);
                  if (bVar9) {
                    pcVar15 = (char *)(ulong)(local_4c0 * 100);
                  }
                  else {
                    pcVar15 = (char *)0xb;
                  }
                }
                bVar7 = false;
              }
              uVar14 = (uint)pcVar15;
              if (!bVar7) break;
              _Var16._M_p = _Var16._M_p + 0x20;
              bVar8 = _Var16._M_p == local_438;
            } while (!bVar8);
          }
          if ((bVar8) && (uVar14 = 0, this->Backup == true)) {
            cmsys::SystemTools::RemoveADirectory(&this->BackupSourceDir);
            cmsys::SystemTools::RemoveADirectory(&this->BackupBinaryDir);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_4b8);
          if (local_458 != &local_448) {
            operator_delete(local_458,CONCAT71(uStack_447,local_448) + 1);
          }
        }
        else {
          uVar14 = 9;
          RestoreBackupDirectories(this);
        }
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_298,"Unable to create the binary directory:\n",filename);
        cmSystemTools::Error((string *)local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._0_8_ != &local_288) {
          operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
        }
        RestoreBackupDirectories(this);
        uVar14 = 7;
      }
    }
  }
LAB_0059773d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,
                    CONCAT71(local_478.field_2._M_allocated_capacity._1_7_,
                             local_478.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,
                    CONCAT71(local_498.field_2._M_allocated_capacity._1_7_,
                             local_498.field_2._M_local_buf[0]) + 1);
  }
  return uVar14;
}

Assistant:

int cmCTestScriptHandler::RunConfigurationDashboard()
{
  // local variables
  std::string command;
  std::string output;
  int retVal;
  bool res;

  // make sure the src directory is there, if it isn't then we might be able
  // to check it out from cvs
  retVal = this->CheckOutSourceDir();
  if (retVal) {
    return retVal;
  }

  // backup the dirs if requested
  retVal = this->BackupDirectories();
  if (retVal) {
    return retVal;
  }

  // clear the binary directory?
  if (this->EmptyBinDir) {
    if (!cmCTestScriptHandler::EmptyBinaryDirectory(this->BinaryDir)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Problem removing the binary directory" << std::endl);
    }
  }

  // make sure the binary directory exists if it isn't the srcdir
  if (!cmSystemTools::FileExists(this->BinaryDir) &&
      this->SourceDir != this->BinaryDir) {
    if (!cmSystemTools::MakeDirectory(this->BinaryDir)) {
      cmSystemTools::Error("Unable to create the binary directory:\n" +
                           this->BinaryDir);
      this->RestoreBackupDirectories();
      return 7;
    }
  }

  // if the binary directory and the source directory are the same,
  // and we are starting with an empty binary directory, then that means
  // we must check out the source tree
  if (this->EmptyBinDir && this->SourceDir == this->BinaryDir) {
    // make sure we have the required info
    if (this->CVSCheckOut.empty()) {
      cmSystemTools::Error(
        "You have specified the source and binary "
        "directories to be the same (an in source build). You have also "
        "specified that the binary directory is to be erased. This means "
        "that the source will have to be checked out from CVS. But you have "
        "not specified CTEST_CVS_CHECKOUT");
      return 8;
    }

    // we must now checkout the src dir
    retVal = this->CheckOutSourceDir();
    if (retVal) {
      this->RestoreBackupDirectories();
      return retVal;
    }
  }

  // backup the dirs if requested
  retVal = this->PerformExtraUpdates();
  if (retVal) {
    return retVal;
  }

  // put the initial cache into the bin dir
  if (!this->InitialCache.empty()) {
    if (!cmCTestScriptHandler::WriteInitialCache(this->BinaryDir,
                                                 this->InitialCache)) {
      this->RestoreBackupDirectories();
      return 9;
    }
  }

  // do an initial cmake to setup the DartConfig file
  int cmakeFailed = 0;
  std::string cmakeFailedOuput;
  if (!this->CMakeCmd.empty()) {
    command = cmStrCat(this->CMakeCmd, " \"", this->SourceDir);
    output.clear();
    command += "\"";
    retVal = 0;
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               "Run cmake command: " << command << std::endl);
    res = cmSystemTools::RunSingleCommand(
      command, &output, &output, &retVal, this->BinaryDir.c_str(),
      this->HandlerVerbose, cmDuration::zero() /*this->TimeOut*/);

    if (!this->CMOutFile.empty()) {
      std::string cmakeOutputFile = this->CMOutFile;
      if (!cmSystemTools::FileIsFullPath(cmakeOutputFile)) {
        cmakeOutputFile = this->BinaryDir + "/" + cmakeOutputFile;
      }

      cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                 "Write CMake output to file: " << cmakeOutputFile
                                                << std::endl);
      cmGeneratedFileStream fout(cmakeOutputFile);
      if (fout) {
        fout << output.c_str();
      } else {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Cannot open CMake output file: "
                     << cmakeOutputFile << " for writing" << std::endl);
      }
    }
    if (!res || retVal != 0) {
      // even if this fails continue to the next step
      cmakeFailed = 1;
      cmakeFailedOuput = output;
    }
  }

  // run ctest, it may be more than one command in here
  std::vector<std::string> ctestCommands = cmExpandedList(this->CTestCmd);
  // for each variable/argument do a putenv
  for (std::string const& ctestCommand : ctestCommands) {
    command = ctestCommand;
    output.clear();
    retVal = 0;
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               "Run ctest command: " << command << std::endl);
    res = cmSystemTools::RunSingleCommand(
      command, &output, &output, &retVal, this->BinaryDir.c_str(),
      this->HandlerVerbose, cmDuration::zero() /*this->TimeOut*/);

    // did something critical fail in ctest
    if (!res || cmakeFailed || retVal & cmCTest::BUILD_ERRORS) {
      this->RestoreBackupDirectories();
      if (cmakeFailed) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Unable to run cmake:" << std::endl
                                          << cmakeFailedOuput << std::endl);
        return 10;
      }
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Unable to run ctest:" << std::endl
                                        << "command: " << command << std::endl
                                        << "output: " << output << std::endl);
      if (!res) {
        return 11;
      }
      return retVal * 100;
    }
  }

  // if all was successful, delete the backup dirs to free up disk space
  if (this->Backup) {
    cmSystemTools::RemoveADirectory(this->BackupSourceDir);
    cmSystemTools::RemoveADirectory(this->BackupBinaryDir);
  }

  return 0;
}